

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.c
# Opt level: O1

void av1_set_screen_content_options(AV1_COMP *cpi,FeatureFlags *features)

{
  uint8_t uVar1;
  int stride;
  SequenceHeader *pSVar2;
  YV12_BUFFER_CONFIG *pYVar3;
  bool bVar4;
  bool bVar5;
  uint uVar6;
  long lVar7;
  uint uVar8;
  int iVar9;
  long lVar10;
  uint8_t *src8;
  int n_colors;
  aom_bit_depth_t local_4a4;
  AV1_COMP *local_4a0;
  long local_498;
  long local_490;
  FeatureFlags *local_488;
  long local_480;
  ulong local_478;
  ulong local_470;
  uint8_t *local_468;
  MACROBLOCKD *local_460;
  buf_2d buf;
  int count_buf [256];
  
  pSVar2 = (cpi->common).seq_params;
  uVar1 = pSVar2->force_screen_content_tools;
  if (uVar1 != '\x02') {
    features->allow_intrabc = uVar1 != '\0';
    features->allow_screen_content_tools = uVar1 != '\0';
    return;
  }
  if ((cpi->oxcf).tune_cfg.content == AOM_CONTENT_SCREEN) {
    features->allow_screen_content_tools = true;
    features->allow_intrabc = (cpi->oxcf).mode != '\x01';
    cpi->use_screen_content_tools = 1;
    cpi->is_screen_content_type = 1;
    return;
  }
  if (((cpi->oxcf).mode != '\x01') &&
     (((cpi->sf).rt_sf.use_nonrd_pick_mode == 0 || ((cpi->sf).rt_sf.hybrid_intra_pickmode != 0)))) {
    pYVar3 = cpi->unfiltered_source;
    local_498 = (long)(pYVar3->field_0).field_0.y_width;
    local_478 = (ulong)(pYVar3->field_1).field_0.y_height;
    local_490 = local_478 * local_498;
    if ((long)local_478 < 0x10) {
      lVar10 = 0;
      lVar7 = 0;
    }
    else {
      local_460 = &(cpi->td).mb.e_mbd;
      src8 = (pYVar3->field_5).buffers[0];
      uVar8 = pYVar3->flags & 8;
      stride = (pYVar3->field_4).field_0.y_stride;
      local_4a4 = pSVar2->bit_depth;
      local_480 = (long)stride << 4;
      local_470 = 0x10;
      lVar7 = 0;
      lVar10 = 0;
      local_4a0 = cpi;
      local_488 = features;
      do {
        local_468 = src8;
        if (0xf < (int)local_498) {
          iVar9 = 0x10;
          do {
            if (uVar8 == 0) {
              av1_count_colors(src8,stride,0x10,0x10,count_buf,&n_colors);
            }
            else {
              av1_count_colors_highbd
                        (src8,stride,0x10,0x10,local_4a4,(int *)0x0,count_buf,&n_colors,(int *)0x0);
            }
            if (n_colors - 2U < 3) {
              lVar7 = lVar7 + 1;
              buf.buf = src8;
              buf.stride = stride;
              uVar6 = av1_get_perpixel_variance(local_4a0,local_460,&buf,BLOCK_16X16,0,uVar8);
              lVar10 = (lVar10 + 1) - (ulong)(uVar6 == 0);
            }
            src8 = src8 + 0x10;
            iVar9 = iVar9 + 0x10;
          } while (iVar9 <= (int)local_498);
        }
        local_470 = local_470 + 0x10;
        src8 = local_468 + local_480;
      } while (local_470 <= local_478);
      lVar7 = lVar7 * 0xa00;
      features = local_488;
      cpi = local_4a0;
    }
    bVar4 = local_490 < lVar7;
    features->allow_screen_content_tools = local_490 < lVar7;
    bVar5 = local_490 < lVar10 * 0xc00;
    uVar8 = 1;
    features->allow_intrabc = bVar5 && bVar4;
    cpi->use_screen_content_tools = (uint)bVar4;
    if ((!bVar5 || !bVar4) &&
       (uVar8 = 0,
       lVar7 != local_490 * 4 && SBORROW8(lVar7,local_490 * 4) == lVar7 + local_490 * -4 < 0)) {
      uVar8 = (uint)(lVar10 * 0x1e00 - local_490 != 0 && local_490 <= lVar10 * 0x1e00);
    }
    cpi->is_screen_content_type = uVar8;
    return;
  }
  features->allow_screen_content_tools = false;
  features->allow_intrabc = false;
  return;
}

Assistant:

void av1_set_screen_content_options(AV1_COMP *cpi, FeatureFlags *features) {
  const AV1_COMMON *const cm = &cpi->common;
  const MACROBLOCKD *const xd = &cpi->td.mb.e_mbd;

  if (cm->seq_params->force_screen_content_tools != 2) {
    features->allow_screen_content_tools = features->allow_intrabc =
        cm->seq_params->force_screen_content_tools;
    return;
  }

  if (cpi->oxcf.tune_cfg.content == AOM_CONTENT_SCREEN) {
    features->allow_screen_content_tools = 1;
    features->allow_intrabc = cpi->oxcf.mode == REALTIME ? 0 : 1;
    cpi->is_screen_content_type = 1;
    cpi->use_screen_content_tools = 1;
    return;
  }

  if (cpi->oxcf.mode == REALTIME) {
    features->allow_screen_content_tools = features->allow_intrabc = 0;
    return;
  }

  // Screen content tools are not evaluated in non-RD encoding mode unless
  // content type is not set explicitly, i.e., when
  // cpi->oxcf.tune_cfg.content != AOM_CONTENT_SCREEN, use_nonrd_pick_mode = 1
  // and hybrid_intra_pickmode = 0. Hence, screen content detection is
  // disabled.
  if (cpi->sf.rt_sf.use_nonrd_pick_mode &&
      !cpi->sf.rt_sf.hybrid_intra_pickmode) {
    features->allow_screen_content_tools = features->allow_intrabc = 0;
    return;
  }

  // Estimate if the source frame is screen content, based on the portion of
  // blocks that have few luma colors.
  const uint8_t *src = cpi->unfiltered_source->y_buffer;
  assert(src != NULL);
  const int use_hbd = cpi->unfiltered_source->flags & YV12_FLAG_HIGHBITDEPTH;
  const int stride = cpi->unfiltered_source->y_stride;
  const int width = cpi->unfiltered_source->y_width;
  const int height = cpi->unfiltered_source->y_height;
  const int64_t area = (int64_t)width * height;
  const int bd = cm->seq_params->bit_depth;
  const int blk_w = 16;
  const int blk_h = 16;
  // These threshold values are selected experimentally.
  const int color_thresh = 4;
  const unsigned int var_thresh = 0;
  // Counts of blocks with no more than color_thresh colors.
  int64_t counts_1 = 0;
  // Counts of blocks with no more than color_thresh colors and variance larger
  // than var_thresh.
  int64_t counts_2 = 0;

  for (int r = 0; r + blk_h <= height; r += blk_h) {
    for (int c = 0; c + blk_w <= width; c += blk_w) {
      int count_buf[1 << 8];  // Maximum (1 << 8) bins for hbd path.
      const uint8_t *const this_src = src + r * stride + c;
      int n_colors;
      if (use_hbd)
        av1_count_colors_highbd(this_src, stride, blk_w, blk_h, bd, NULL,
                                count_buf, &n_colors, NULL);
      else
        av1_count_colors(this_src, stride, blk_w, blk_h, count_buf, &n_colors);
      if (n_colors > 1 && n_colors <= color_thresh) {
        ++counts_1;
        struct buf_2d buf;
        buf.stride = stride;
        buf.buf = (uint8_t *)this_src;
        const unsigned int var = av1_get_perpixel_variance(
            cpi, xd, &buf, BLOCK_16X16, AOM_PLANE_Y, use_hbd);
        if (var > var_thresh) ++counts_2;
      }
    }
  }

  // The threshold values are selected experimentally.
  features->allow_screen_content_tools = counts_1 * blk_h * blk_w * 10 > area;
  // IntraBC would force loop filters off, so we use more strict rules that also
  // requires that the block has high variance.
  features->allow_intrabc = features->allow_screen_content_tools &&
                            counts_2 * blk_h * blk_w * 12 > area;
  cpi->use_screen_content_tools = features->allow_screen_content_tools;
  cpi->is_screen_content_type =
      features->allow_intrabc || (counts_1 * blk_h * blk_w * 10 > area * 4 &&
                                  counts_2 * blk_h * blk_w * 30 > area);
}